

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_star_expression.cpp
# Opt level: O3

StarExpressionType __thiscall
duckdb::Binder::FindStarExpression
          (Binder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr,StarExpression **star,bool is_root,bool in_columns)

{
  ExpressionType EVar1;
  StarExpression *pSVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  pointer puVar4;
  StarExpressionType SVar5;
  bool bVar6;
  int iVar7;
  pointer pPVar8;
  BaseExpression *pBVar9;
  OperatorExpression *pOVar10;
  reference expr_00;
  BinderException *pBVar11;
  StarExpression *expr_01;
  type pPVar12;
  duckdb *this_00;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> this_01;
  ParsedExpression *expr_02;
  pointer this_02;
  StarExpressionType has_star;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  star_list;
  vector<duckdb::Value,_true> values;
  StarExpressionType local_11a;
  undefined1 local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_d8;
  StarExpression **local_c0;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_b8;
  vector<duckdb::Value,_true> local_a0;
  LogicalType local_88;
  Value local_70;
  
  local_11a = NONE;
  local_119 = in_columns;
  local_c0 = star;
  pPVar8 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(expr);
  EVar1 = (pPVar8->super_BaseExpression).type;
  pBVar9 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            ::operator->(expr)->super_BaseExpression;
  if (EVar1 == OPERATOR_UNPACK) {
    pOVar10 = BaseExpression::Cast<duckdb::OperatorExpression>(pBVar9);
    expr_00 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[](&pOVar10->children,0);
    SVar5 = FindStarExpression(this,expr_00,star,is_root,in_columns);
    if (SVar5 < UNPACKED) {
      return UNPACKED;
    }
    pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
    local_118._M_unused._M_object = &local_108;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,
               "UNPACK can only be used in combination with a STAR (*) expression or COLUMNS expression"
               ,"");
    BinderException::BinderException(pBVar11,(string *)&local_118);
    __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (pBVar9->expression_class == STAR) {
    pBVar9 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(expr)->super_BaseExpression;
    expr_01 = BaseExpression::Cast<duckdb::StarExpression>(pBVar9);
    pPVar12 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(expr);
    bVar6 = StarExpression::IsStar(pPVar12);
    if (bVar6) {
      if (is_root) {
        *star = expr_01;
      }
      else {
        if (!in_columns) {
          pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
          local_118._M_unused._M_object = &local_108;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,
                     "STAR expression is only allowed as the root element of an expression. Use COLUMNS(*) instead."
                     ,"");
          BinderException::BinderException(pBVar11,(string *)&local_118);
          __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((expr_01->replace_list)._M_h._M_element_count != 0) {
          pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
          local_118._M_unused._M_object = &local_108;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,
                     "STAR expression with REPLACE list is only allowed as the root element of COLUMNS"
                     ,"");
          BinderException::BinderException(pBVar11,(string *)&local_118);
          __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((expr_01->rename_list)._M_h._M_element_count != 0) {
          pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
          local_118._M_unused._M_object = &local_108;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,
                     "STAR expression with RENAME list is only allowed as the root element of COLUMNS"
                     ,"");
          BinderException::BinderException(pBVar11,(string *)&local_118);
          __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_d8.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)0x0;
        local_d8.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)0x0;
        local_d8.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        BindContext::GenerateAllColumnExpressions
                  (&this->bind_context,expr_01,
                   (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    *)&local_d8);
        local_b8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::reserve
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b8,
                   (long)local_d8.
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_d8.
                         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
        puVar4 = local_d8.
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_d8.
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_d8.
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          this_02 = local_d8.
                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            this_00 = (duckdb *)
                      unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*(this_02);
            GetColumnsStringValue_abi_cxx11_((string *)&local_118,this_00,expr_02);
            ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
            emplace_back<std::__cxx11::string>
                      ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_118);
            if ((code **)local_118._M_unused._0_8_ != &local_108) {
              operator_delete(local_118._M_unused._M_object);
            }
            this_02 = this_02 + 1;
          } while (this_02 != puVar4);
        }
        LogicalType::LogicalType(&local_88,VARCHAR);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_a0,&local_b8);
        Value::LIST(&local_70,&local_88,&local_a0);
        this_01._M_head_impl = (ParsedExpression *)operator_new(0x78);
        Value::Value((Value *)&local_118,&local_70);
        ConstantExpression::ConstantExpression
                  ((ConstantExpression *)this_01._M_head_impl,(Value *)&local_118);
        Value::~Value((Value *)&local_118);
        _Var3._M_head_impl =
             (expr->
             super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        (expr->
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             this_01._M_head_impl;
        if (_Var3._M_head_impl != (ParsedExpression *)0x0) {
          (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
        }
        Value::~Value(&local_70);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_a0);
        LogicalType::~LogicalType(&local_88);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b8);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector(&local_d8);
      }
    }
    else {
      if (in_columns) {
        pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
        local_118._M_unused._M_object = &local_108;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,
                   "COLUMNS expression is not allowed inside another COLUMNS expression","");
        BinderException::BinderException(pBVar11,(string *)&local_118);
        __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_119 = 1;
      pSVar2 = *star;
      if (pSVar2 == (StarExpression *)0x0) {
        *star = expr_01;
        local_11a = STAR;
        goto LAB_006cc70b;
      }
      iVar7 = (*(pSVar2->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[10])
                        (pSVar2,expr_01);
      if ((char)iVar7 == '\0') {
        pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
        pPVar12 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(expr);
        local_118._M_unused._M_object = &local_108;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,
                   "Multiple different STAR/COLUMNS in the same expression are not supported","");
        BinderException::BinderException<>(pBVar11,pPVar12,(string *)&local_118);
        __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    local_11a = STAR;
  }
  else {
LAB_006cc70b:
    pPVar12 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(expr);
    local_118._8_8_ = 0;
    local_118._M_unused._M_object = operator_new(0x20);
    *(Binder **)local_118._M_unused._0_8_ = this;
    *(StarExpression ****)((long)local_118._M_unused._0_8_ + 8) = &local_c0;
    *(undefined1 **)((long)local_118._M_unused._0_8_ + 0x10) = &local_119;
    *(StarExpressionType **)((long)local_118._M_unused._0_8_ + 0x18) = &local_11a;
    local_100 = ::std::
                _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_star_expression.cpp:91:53)>
                ::_M_invoke;
    local_108 = ::std::
                _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_star_expression.cpp:91:53)>
                ::_M_manager;
    ParsedExpressionIterator::EnumerateChildren
              (pPVar12,(function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
                        *)&local_118);
    if (local_108 != (code *)0x0) {
      (*local_108)(&local_118,&local_118,3);
    }
  }
  return local_11a;
}

Assistant:

StarExpressionType Binder::FindStarExpression(unique_ptr<ParsedExpression> &expr, StarExpression **star, bool is_root,
                                              bool in_columns) {
	StarExpressionType has_star = StarExpressionType::NONE;
	if (expr->GetExpressionType() == ExpressionType::OPERATOR_UNPACK) {
		auto &operator_expr = expr->Cast<OperatorExpression>();
		auto res = FindStarExpression(operator_expr.children[0], star, is_root, in_columns);
		if (res != StarExpressionType::STAR && res != StarExpressionType::COLUMNS) {
			throw BinderException(
			    "UNPACK can only be used in combination with a STAR (*) expression or COLUMNS expression");
		}
		return StarExpressionType::UNPACKED;
	}
	if (expr->GetExpressionClass() == ExpressionClass::STAR) {
		auto &current_star = expr->Cast<StarExpression>();
		if (StarExpression::IsStar(*expr)) {
			if (is_root) {
				D_ASSERT(!in_columns);
				// At the root level
				*star = &current_star;
				return StarExpressionType::STAR;
			}

			if (!in_columns) {
				// '*' can only appear inside COLUMNS or at the root level
				throw BinderException(
				    "STAR expression is only allowed as the root element of an expression. Use COLUMNS(*) instead.");
			}

			if (!current_star.replace_list.empty()) {
				// '*' inside COLUMNS can not have a REPLACE list
				throw BinderException(
				    "STAR expression with REPLACE list is only allowed as the root element of COLUMNS");
			}
			if (!current_star.rename_list.empty()) {
				// '*' inside COLUMNS can not have a REPLACE list
				throw BinderException(
				    "STAR expression with RENAME list is only allowed as the root element of COLUMNS");
			}

			// '*' expression inside a COLUMNS - convert to a constant list of strings (column names)
			vector<unique_ptr<ParsedExpression>> star_list;
			bind_context.GenerateAllColumnExpressions(current_star, star_list);

			vector<Value> values;
			values.reserve(star_list.size());
			for (auto &element : star_list) {
				values.emplace_back(GetColumnsStringValue(*element));
			}
			D_ASSERT(!values.empty());
			expr = make_uniq<ConstantExpression>(Value::LIST(LogicalType::VARCHAR, values));
			return StarExpressionType::STAR;
		}
		if (in_columns) {
			throw BinderException("COLUMNS expression is not allowed inside another COLUMNS expression");
		}
		in_columns = true;

		if (*star) {
			// we can have multiple
			if (!(*star)->Equals(current_star)) {
				throw BinderException(*expr,
				                      "Multiple different STAR/COLUMNS in the same expression are not supported");
			}
			return StarExpressionType::STAR;
		}
		*star = &current_star;
		has_star = StarExpressionType::STAR;
	}
	ParsedExpressionIterator::EnumerateChildren(*expr, [&](unique_ptr<ParsedExpression> &child_expr) {
		auto res = FindStarExpression(child_expr, star, false, in_columns);
		if (res != StarExpressionType::NONE) {
			has_star = res;
		}
	});
	return has_star;
}